

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O3

string * __thiscall remote::Handle::GetPath_abi_cxx11_(string *__return_storage_ptr__,Handle *this)

{
  long *plVar1;
  size_type *psVar2;
  string local_50;
  string local_30;
  
  GetProcDirectory_abi_cxx11_(&local_30,this);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_30);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50.field_2._8_8_ = plVar1[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_50._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  FileSystem::ResolveSymLink(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Handle::GetPath() {
    return FileSystem::ResolveSymLink(GetProcDirectory() + "/exe");
}